

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

void clear_list(list *list,_Bool destroy)

{
  list *plVar1;
  list *__ptr;
  list *plVar2;
  
  plVar1 = (list *)list->head;
  while (__ptr = plVar1, __ptr != (list *)0x0) {
    plVar1 = (list *)__ptr->head;
    plVar2 = (list *)__ptr->tail;
    if ((list *)__ptr->tail == (list *)0x0) {
      plVar2 = list;
    }
    plVar2->head = (node *)plVar1;
    plVar2 = plVar1;
    if (plVar1 == (list *)0x0) {
      plVar2 = list;
    }
    plVar2->tail = __ptr->tail;
    __ptr->head = (node *)0x0;
    __ptr->tail = (node *)0x0;
    list->size = list->size - 1;
    if (destroy) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void clear_list(struct list *list, bool destroy)
{
        struct node *node = list->head;
        struct node *next = NULL;

        while (node != NULL) {
                next = node->next;

                list_remove(list, node);

                if (destroy) {
                        node_destroy(node);
                }

                node = next;
        }
}